

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool S2::UpdateMinInteriorDistance(S2Point *x,S2Point *a,S2Point *b,S1ChordAngle *min_dist)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = x->c_[1] - a->c_[1];
  dVar2 = x->c_[0] - a->c_[0];
  dVar3 = x->c_[2] - a->c_[2];
  dVar6 = x->c_[1] - b->c_[1];
  dVar4 = x->c_[0] - b->c_[0];
  dVar5 = x->c_[2] - b->c_[2];
  bVar1 = AlwaysUpdateMinInteriorDistance<false>
                    (x,a,b,dVar3 * dVar3 + dVar7 * dVar7 + dVar2 * dVar2,
                     dVar5 * dVar5 + dVar6 * dVar6 + dVar4 * dVar4,min_dist);
  return bVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }